

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::anon_unknown_0::ParseEditionsTest_OptionalKeywordBanned_Test::
~ParseEditionsTest_OptionalKeywordBanned_Test(ParseEditionsTest_OptionalKeywordBanned_Test *this)

{
  ParserTest::~ParserTest(&this->super_ParseEditionsTest);
  operator_delete(this,0xf0);
  return;
}

Assistant:

TEST_F(ParseEditionsTest, OptionalKeywordBanned) {
  ExpectHasErrors(
      R"schema(
        edition = "2023";
        message A {
          optional int32 b = 1;
        })schema",
      "3:10: Label \"optional\" is not supported in editions. By default, all "
      "singular fields have presence unless features.field_presence is set.\n");
}